

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fmt::v9::sprintf<char[46],char[4608],char[4608],int,int,char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,v9 *this,char (*fmt) [46],char (*args) [4608],char (*args_1) [4608],int *args_2,
          int *args_3)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>_2
  aVar1;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> args_00;
  v9 *local_88;
  size_t local_80;
  char (*local_78 [2]) [46];
  char (*local_68) [4608];
  ulong local_58;
  ulong local_48;
  
  aVar1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>_2
           )args_1;
  local_80 = strlen((char *)this);
  local_58 = (ulong)*(uint *)*args_1;
  local_48 = (ulong)(uint)*args_2;
  args_00.field_1.values_ = aVar1.values_;
  args_00.desc_ = (unsigned_long_long)local_78;
  local_88 = this;
  local_78[0] = fmt;
  local_68 = args;
  vsprintf<fmt::v9::basic_string_view<char>,char>
            (__return_storage_ptr__,(v9 *)&local_88,(basic_string_view<char> *)0x11cc,args_00);
  return __return_storage_ptr__;
}

Assistant:

inline auto sprintf(const S& fmt, const T&... args) -> std::basic_string<Char> {
  using context = basic_printf_context_t<Char>;
  return vsprintf(detail::to_string_view(fmt),
                  fmt::make_format_args<context>(args...));
}